

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<float>::Subst_LBackward(TPZMatrix<float> *this,TPZFMatrix<float> *B)

{
  long lVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  float fVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int64_t i;
  float sum;
  int64_t c;
  int64_t r;
  char *in_stack_00000188;
  char *in_stack_00000190;
  float local_34;
  long local_30;
  float local_24;
  long local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar3 != lVar4) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_00000190,in_stack_00000188);
  }
  local_18 = (**(code **)(*in_RDI + 0x60))();
  while (local_18 = local_18 + -1, -1 < local_18) {
    for (local_20 = 0; lVar4 = local_20, iVar3 = TPZBaseMatrix::Cols(local_10), lVar4 < iVar3;
        local_20 = local_20 + 1) {
      local_24 = 0.0;
      local_30 = (**(code **)(*in_RDI + 0x60))();
      while (pTVar2 = local_10, lVar1 = local_18, lVar4 = local_20, local_30 = local_30 + -1,
            local_18 < local_30) {
        fVar5 = (float)(**(code **)(*in_RDI + 0x120))(in_RDI,local_18,local_30);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_30,local_20);
        local_24 = fVar5 * extraout_XMM0_Da + local_24;
      }
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_18,local_20);
      local_34 = extraout_XMM0_Da_00 - local_24;
      (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar1,lVar4,&local_34);
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}